

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

TabularCPT * __thiscall
despot::Parser::CreateTabularObsFunction(Parser *this,TiXmlElement *e_CondProb)

{
  pointer pbVar1;
  pointer pdVar2;
  bool bVar3;
  bool condition;
  int iVar4;
  TiXmlNode *pTVar5;
  mapped_type *ppVVar6;
  TabularCPT *this_00;
  TiXmlElement *pTVar7;
  long lVar8;
  pointer pbVar9;
  Parser *this_01;
  int i;
  pointer child;
  long lVar10;
  ulong uVar11;
  double dVar12;
  TiXmlElement *local_2c8;
  string parent_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  string local_270;
  pointer local_250;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  vector<double,_std::allocator<double>_> values;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  _Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_1a8;
  string name;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  GetFirstChildText_abi_cxx11_(&name,this,e_CondProb,"Var");
  std::__cxx11::string::string((string *)&local_130,(string *)&name);
  bVar3 = Variable::IsVariableName(&local_130,&this->obs_vars_);
  std::operator+(&parent_name,"In <ObsFunction>: Variable ",&name);
  std::operator+(&local_150,&parent_name,
                 " has not been declared as an ObsVar vname within the <Variable> tag.");
  pTVar5 = util::tinyxml::TiXmlNode::FirstChild(&e_CondProb->super_TiXmlNode,"Var");
  Ensure(this,bVar3,&local_150,&pTVar5->super_TiXmlBase);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&parent_name);
  std::__cxx11::string::~string((string *)&local_130);
  ppVVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
            ::operator[](&this->variables_,&name);
  local_250 = (pointer)*ppVVar6;
  parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetFirstChildText_abi_cxx11_(&parent_name,this,e_CondProb,"Parent");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270," ",(allocator<char> *)&local_218);
  Tokenize(&parent_names,&parent_name,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&parent_name);
  lVar8 = 0;
  for (uVar11 = 0;
      uVar11 < (ulong)((long)parent_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)parent_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar11 = uVar11 + 1) {
    std::__cxx11::string::string
              ((string *)&parent_name,
               (string *)
               ((long)&((parent_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8));
    std::__cxx11::string::string((string *)&local_50,(string *)&parent_name);
    bVar3 = Variable::IsVariableName(&local_50,&this->curr_state_vars_);
    condition = true;
    if (!bVar3) {
      std::__cxx11::string::string((string *)&local_170,(string *)&parent_name);
      condition = Variable::IsVariableName(&local_170,&this->action_vars_);
    }
    std::operator+(&local_270,"In <ObsFunction>: Parent ",&parent_name);
    std::operator+(&local_70,&local_270,
                   " has not been declared as a StateVar vnameCurr or an ActionVar vname within the <Variable> tag."
                  );
    pTVar5 = util::tinyxml::TiXmlNode::FirstChild(&e_CondProb->super_TiXmlNode,"Parent");
    Ensure(this,condition,&local_70,&pTVar5->super_TiXmlBase);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_270);
    if (!bVar3) {
      std::__cxx11::string::~string((string *)&local_170);
    }
    std::__cxx11::string::~string((string *)&local_50);
    ppVVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](&this->variables_,&parent_name);
    local_270._M_dataplus._M_p = (pointer)*ppVVar6;
    std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
    emplace_back<despot::NamedVar*>
              ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&parents,
               (NamedVar **)&local_270);
    std::__cxx11::string::~string((string *)&parent_name);
    lVar8 = lVar8 + 0x20;
  }
  this_00 = (TabularCPT *)operator_new(0x70);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_1a8,&parents)
  ;
  child = local_250;
  TabularCPT::TabularCPT
            (this_00,&local_250->super_NamedVar,
             (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_1a8);
  std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
            (&local_1a8);
  pTVar7 = GetParameterElement(this,e_CondProb);
  local_2c8 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar7->super_TiXmlNode,"Entry");
  while (local_2c8 != (TiXmlElement *)0x0) {
    GetFirstChildText_abi_cxx11_(&parent_name,this,local_2c8,"Instance");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270," ",(allocator<char> *)&local_218);
    Tokenize(&instance,&parent_name,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&parent_name);
    values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    this_01 = (Parser *)&parent_name;
    GetFirstChildText_abi_cxx11_(&parent_name,this,local_2c8,"ProbTable");
    iVar4 = ComputeNumOfEntries(this_01,&instance,&parents,&child->super_NamedVar);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &parent_name,"uniform");
    if (bVar3) {
      pbVar9 = (child->super_NamedVar).super_Variable.values_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar1 = (child->super_NamedVar).super_Variable.values_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      while (iVar4 != 0) {
        local_270._M_dataplus._M_p =
             (pointer)(1.0 / (double)(int)((ulong)((long)pbVar9 - (long)pbVar1) >> 5));
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)
                   &values.super__Vector_base<double,_std::allocator<double>_>,(double *)&local_270)
        ;
        iVar4 = iVar4 + -1;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270," ",(allocator<char> *)&local_218);
      Tokenize(&value_tokens,&parent_name,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      lVar8 = (long)value_tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)value_tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      to_string<int>(&local_d0,iVar4);
      std::operator+(&local_90,"In <ObsFunction>: ",&local_d0);
      std::operator+(&local_218,&local_90," entries expected but ");
      to_string<unsigned_long>
                (&local_f0,
                 (long)value_tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)value_tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      std::operator+(&local_270,&local_218,&local_f0);
      std::operator+(&local_b0,&local_270," found.");
      pTVar7 = util::tinyxml::TiXmlNode::FirstChildElement(&local_2c8->super_TiXmlNode,"ProbTable");
      Ensure(this,lVar8 >> 5 == (long)iVar4,&local_b0,(TiXmlBase *)pTVar7);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 &values.super__Vector_base<double,_std::allocator<double>_>,
                 (long)value_tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)value_tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      pdVar2 = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = (long)value_tokens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)value_tokens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 = value_tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (lVar8 = 0; lVar10 >> 5 != lVar8; lVar8 = lVar8 + 1) {
        dVar12 = atof((pbVar9->_M_dataplus)._M_p);
        pdVar2[lVar8] = dVar12;
        pbVar9 = pbVar9 + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&value_tokens);
    }
    iVar4 = (*(this_00->super_CPT).super_Function._vptr_Function[2])
                      (this_00,&instance,&values.super__Vector_base<double,_std::allocator<double>_>
                      );
    child = local_250;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"In <ObsFunction>: Value assignment failed.",
               (allocator<char> *)&local_270);
    pTVar7 = util::tinyxml::TiXmlNode::FirstChildElement(&local_2c8->super_TiXmlNode,"Instance");
    Ensure(this,SUB41(iVar4,0),&local_110,(TiXmlBase *)pTVar7);
    std::__cxx11::string::~string((string *)&local_110);
    local_2c8 = util::tinyxml::TiXmlNode::NextSiblingElement(&local_2c8->super_TiXmlNode);
    std::__cxx11::string::~string((string *)&parent_name);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&values.super__Vector_base<double,_std::allocator<double>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&instance);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parent_names);
  std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
            (&parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>);
  std::__cxx11::string::~string((string *)&name);
  return this_00;
}

Assistant:

TabularCPT* Parser::CreateTabularObsFunction(TiXmlElement* e_CondProb) {
	// <Var>
	string name = GetFirstChildText(e_CondProb, "Var");

	Ensure(Variable::IsVariableName(name, obs_vars_),
		"In <ObsFunction>: Variable " + name
			+ " has not been declared as an ObsVar vname within the <Variable> tag.",
		e_CondProb->FirstChild("Var"));

	ObsVar* child = static_cast<ObsVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(
		GetFirstChildText(e_CondProb, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string parent_name = parent_names[i];
		Ensure(
			Variable::IsVariableName(parent_name, curr_state_vars_)
				|| Variable::IsVariableName(parent_name, action_vars_),
			"In <ObsFunction>: Parent " + parent_name
				+ " has not been declared as a StateVar vnameCurr or an ActionVar vname within the <Variable> tag.",
			e_CondProb->FirstChild("Parent"));

		parents.push_back(static_cast<StateVar*>(variables_[parent_name]));
	}

	TabularCPT* func = new TabularCPT(child, parents);

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_CondProb);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));

		// <ProbTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ProbTable");

		int num_entries = ComputeNumOfEntries(instance, parents, child);

		if (table == "uniform") { // keyword uniform
			int num = child->Size();
			for (int i = 0; i < num_entries; i++) {
				values.push_back(1.0 / num);
			}
		} else { // numbers
			vector<string> value_tokens = Tokenize(table);

			Ensure(num_entries == value_tokens.size(),
				"In <ObsFunction>: " + to_string(num_entries)
					+ " entries expected but " + to_string(value_tokens.size())
					+ " found.", GetFirstChildElement(e_Entry, "ProbTable"));

			values.resize(value_tokens.size());
			for (int i = 0; i < value_tokens.size(); i++) {
				values[i] = atof(value_tokens[i].c_str());
			}
		}

		bool success = func->SetValue(instance, values);

		Ensure(success, "In <ObsFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}